

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_> * __thiscall
libtorrent::picker_log_alert::blocks
          (vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
           *__return_storage_ptr__,picker_log_alert *this)

{
  unsigned_long __n;
  stack_allocator *this_00;
  char *__src;
  piece_block *__dest;
  char *start;
  allocator<libtorrent::piece_block> local_22;
  undefined1 local_21;
  unsigned_long local_20;
  size_t num_blocks;
  picker_log_alert *this_local;
  vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_> *ret;
  
  num_blocks = (size_t)this;
  this_local = (picker_log_alert *)__return_storage_ptr__;
  __n = libtorrent::aux::numeric_cast<unsigned_long,int,void>(this->m_num_blocks);
  local_21 = 0;
  local_20 = __n;
  std::allocator<libtorrent::piece_block>::allocator(&local_22);
  std::vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>::vector
            (__return_storage_ptr__,__n,&local_22);
  std::allocator<libtorrent::piece_block>::~allocator(&local_22);
  this_00 = std::reference_wrapper<const_libtorrent::aux::stack_allocator>::get
                      (&(this->super_peer_alert).super_torrent_alert.m_alloc);
  __src = libtorrent::aux::stack_allocator::ptr(this_00,(allocation_slot)(this->m_array_idx).m_idx);
  __dest = std::vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>::data
                     (__return_storage_ptr__);
  memcpy(__dest,__src,local_20 << 3);
  return __return_storage_ptr__;
}

Assistant:

std::vector<piece_block> picker_log_alert::blocks() const
	{
		// we need to copy this array to make sure the structures are properly
		// aligned, not just to have a nice API
		std::size_t const num_blocks = aux::numeric_cast<std::size_t>(m_num_blocks);
		std::vector<piece_block> ret(num_blocks);

		char const* start = m_alloc.get().ptr(m_array_idx);
		std::memcpy(ret.data(), start, num_blocks * sizeof(piece_block));

		return ret;
	}